

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

void helicsDataBufferToRawString
               (HelicsDataBuffer data,char *outputString,int maxStringLen,int *actualLength)

{
  int iVar1;
  byte *data_00;
  int *piVar2;
  char *__src;
  int *in_RCX;
  int in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  int length;
  string v;
  SmallBuffer *ptr;
  string *in_stack_00000120;
  DataType in_stack_0000012c;
  data_view *in_stack_00000130;
  HelicsDataBuffer in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  SmallBuffer *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  SmallBuffer *local_28;
  int *local_20;
  int local_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  if ((in_RSI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
     (in_EDX < 1)) {
    if (in_RCX != (int *)0x0) {
      *in_RCX = 0;
    }
  }
  else {
    local_20 = in_RCX;
    local_10 = in_RSI;
    local_28 = getBuffer(in_stack_ffffffffffffff68);
    if (local_28 == (SmallBuffer *)0x0) {
      if (local_20 != (int *)0x0) {
        *local_20 = 0;
      }
    }
    else {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      helics::data_view::data_view
                ((data_view *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      data_00 = helics::SmallBuffer::data(local_28);
      helics::detail::detectType(data_00);
      helics::valueExtract(in_stack_00000130,in_stack_0000012c,in_stack_00000120);
      helics::data_view::~data_view((data_view *)0x1f46b6);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (&local_48);
      piVar2 = std::min<int>((int *)&stack0xffffffffffffff84,&local_14);
      iVar1 = *piVar2;
      __src = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1f46ff);
      memcpy(local_10,__src,(long)iVar1);
      if (local_20 != (int *)0x0) {
        *local_20 = iVar1;
      }
      std::__cxx11::string::~string(local_10);
    }
  }
  return;
}

Assistant:

void helicsDataBufferToRawString(HelicsDataBuffer data, char* outputString, int maxStringLen, int* actualLength)
{
    if ((outputString == nullptr) || (maxStringLen <= 0)) {
        if (actualLength != nullptr) {
            *actualLength = 0;
        }
        return;
    }
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        if (actualLength != nullptr) {
            *actualLength = 0;
        }
        return;
    }
    std::string v;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);

    auto length = (std::min)(static_cast<int>(v.size()), maxStringLen);
    // NOLINTNEXTLINE
    std::memcpy(outputString, v.data(), length);

    if (actualLength != nullptr) {
        *actualLength = length;
    }
}